

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O0

void __thiscall Init::WorkspaceFolders::reflect(WorkspaceFolders *this,StringWriter *writer)

{
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *pWVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *local_18;
  StringWriter *writer_local;
  WorkspaceFolders *this_local;
  
  local_18 = writer;
  writer_local = (StringWriter *)this;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(writer);
  pWVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"supported",&local_39);
  reflectBool(pWVar1,&local_38,(bool)(this->supported & 1),true);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pWVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"changeNotifications",&local_71);
  reflectString(pWVar1,&local_70,&this->changeNotifications,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(local_18,0);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "supported", supported);
            reflectString(writer, "changeNotifications", changeNotifications);
            writer.EndObject();
        }